

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O1

shared_ptr<GenApi_3_4::CNodeMapRef> __thiscall rcg::Device::getNodeMap(Device *this,char *xml)

{
  pthread_mutex_t *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  CPort *pCVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  undefined8 uVar5;
  char *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<GenApi_3_4::CNodeMapRef> sVar6;
  CPort *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  shared_ptr<const_rcg::GenTLWrapper> local_50;
  shared_ptr<const_rcg::GenTLWrapper> local_40;
  
  __mutex = (pthread_mutex_t *)(xml + 0x50);
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 == 0) {
    if ((*(long *)(xml + 0x80) != 0) && (*(long *)(xml + 0xe8) == 0)) {
      local_68 = (CPort *)operator_new(0x20);
      local_40.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(xml + 0x20);
      local_40.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(xml + 0x28);
      if (local_40.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_40.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_40.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_40.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_40.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      CPort::CPort(local_68,&local_40,(void **)(xml + 0x80));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<rcg::CPort*>
                (a_Stack_60,local_68);
      _Var3._M_pi = a_Stack_60[0]._M_pi;
      pCVar2 = local_68;
      local_68 = (CPort *)0x0;
      a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(xml + 0xd0);
      *(CPort **)(xml + 200) = pCVar2;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(xml + 0xd0) = _Var3._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
      }
      if (local_40.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(xml + 0x20);
      local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(xml + 0x28);
      if (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      allocNodeMap((rcg *)&local_68,&local_50,*(void **)(xml + 0x80),*(CPort **)(xml + 200),in_RDX);
      _Var3._M_pi = a_Stack_60[0]._M_pi;
      pCVar2 = local_68;
      local_68 = (CPort *)0x0;
      a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(xml + 0xf0);
      *(CPort **)(xml + 0xe8) = pCVar2;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(xml + 0xf0) = _Var3._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
      }
      if (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    (this->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
    super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(xml + 0xe8);
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(xml + 0xf0);
    (this->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
    super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    pthread_mutex_unlock(__mutex);
    sVar6.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = extraout_RDX._M_pi;
    sVar6.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<GenApi_3_4::CNodeMapRef>)
           sVar6.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar5 = std::__throw_system_error(iVar4);
  if (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pthread_mutex_unlock(__mutex);
  _Unwind_Resume(uVar5);
}

Assistant:

std::shared_ptr<GenApi::CNodeMapRef> Device::getNodeMap(const char *xml)
{
  std::lock_guard<std::mutex> lock(mtx);

  if (dev != 0 && !nodemap)
  {
    cport=std::shared_ptr<CPort>(new CPort(gentl, &dev));
    nodemap=allocNodeMap(gentl, dev, cport.get(), xml);
  }

  return nodemap;
}